

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O0

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample2D
          (SampleVerifier *this,IVec3 *texelBase,Vec2 *weights,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  float fVar1;
  float *pfVar2;
  long lVar3;
  double dVar4;
  float local_2c4;
  float local_2b4;
  Interval *local_298;
  Vector<float,_4> *local_278;
  float *local_258;
  int local_24c;
  undefined1 local_248 [4];
  int compNdx_1;
  Interval local_230;
  Interval local_218;
  undefined1 local_200 [8];
  Interval texelInterval;
  undefined1 local_1e0 [4];
  int compNdx;
  Interval local_1c8;
  undefined1 local_1b0 [8];
  Interval jWeightInterval;
  undefined1 local_190 [4];
  int j_1;
  undefined1 local_178 [8];
  Interval iWeightInterval;
  undefined1 auStack_158 [4];
  int i_1;
  double local_150;
  double local_148;
  int local_13c;
  undefined1 local_138 [4];
  int ndx;
  Interval resultIntervals [4];
  IVec3 local_cc;
  int local_c0;
  int local_bc;
  int j;
  int i;
  Vec4 texelsMax [4];
  Vec4 texelsMin [4];
  Vec4 *resultMin_local;
  int level_local;
  int layer_local;
  Vec2 *weights_local;
  IVec3 *texelBase_local;
  SampleVerifier *this_local;
  
  local_258 = texelsMax[3].m_data + 2;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_258);
    local_258 = local_258 + 4;
  } while (local_258 != texelsMin[3].m_data + 2);
  local_278 = (Vector<float,_4> *)&j;
  do {
    tcu::Vector<float,_4>::Vector(local_278);
    local_278 = local_278 + 1;
  } while (local_278 != (Vector<float,_4> *)(texelsMax[3].m_data + 2));
  for (local_bc = 0; local_bc < 2; local_bc = local_bc + 1) {
    for (local_c0 = 0; local_c0 < 2; local_c0 = local_c0 + 1) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&resultIntervals[3].m_hi,local_bc,local_c0,0);
      tcu::operator+((tcu *)&local_cc,texelBase,(Vector<int,_3> *)&resultIntervals[3].m_hi);
      fetchTexel(this,&local_cc,layer,level,VK_FILTER_LINEAR,
                 (Vec4 *)(texelsMax[(long)(local_c0 * 2 + local_bc) + 3].m_data + 2),
                 (Vec4 *)(&j + (long)(local_c0 * 2 + local_bc) * 4));
    }
  }
  local_298 = (Interval *)local_138;
  do {
    tcu::Interval::Interval(local_298);
    local_298 = local_298 + 1;
  } while (local_298 != (Interval *)&resultIntervals[3].m_hi);
  for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
    tcu::Interval::Interval((Interval *)auStack_158,0.0);
    lVar3 = (long)local_13c;
    *(undefined8 *)(local_138 + lVar3 * 0x18) = _auStack_158;
    *(double *)(resultIntervals + lVar3) = local_150;
    resultIntervals[lVar3].m_lo = local_148;
  }
  for (iWeightInterval.m_hi._4_4_ = 0; iWeightInterval.m_hi._4_4_ < 2;
      iWeightInterval.m_hi._4_4_ = iWeightInterval.m_hi._4_4_ + 1) {
    if (iWeightInterval.m_hi._4_4_ == 0) {
      pfVar2 = tcu::Vector<float,_2>::operator[](weights,1);
      local_2b4 = 1.0 - *pfVar2;
    }
    else {
      pfVar2 = tcu::Vector<float,_2>::operator[](weights,1);
      local_2b4 = *pfVar2;
    }
    tcu::Interval::Interval((Interval *)local_190,(double)local_2b4);
    tcu::FloatFormat::roundOut
              ((Interval *)local_178,&this->m_filteringPrecision,(Interval *)local_190,false);
    for (jWeightInterval.m_hi._4_4_ = 0; jWeightInterval.m_hi._4_4_ < 2;
        jWeightInterval.m_hi._4_4_ = jWeightInterval.m_hi._4_4_ + 1) {
      if (jWeightInterval.m_hi._4_4_ == 0) {
        pfVar2 = tcu::Vector<float,_2>::operator[](weights,0);
        local_2c4 = 1.0 - *pfVar2;
      }
      else {
        pfVar2 = tcu::Vector<float,_2>::operator[](weights,0);
        local_2c4 = *pfVar2;
      }
      tcu::Interval::Interval((Interval *)local_1e0,(double)local_2c4);
      tcu::operator*(&local_1c8,(Interval *)local_178,(Interval *)local_1e0);
      tcu::FloatFormat::roundOut((Interval *)local_1b0,&this->m_filteringPrecision,&local_1c8,false)
      ;
      for (texelInterval.m_hi._4_4_ = 0; texelInterval.m_hi._4_4_ < 4;
          texelInterval.m_hi._4_4_ = texelInterval.m_hi._4_4_ + 1) {
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (texelsMax[(long)(iWeightInterval.m_hi._4_4_ * 2 +
                                             jWeightInterval.m_hi._4_4_) + 3].m_data + 2),
                            texelInterval.m_hi._4_4_);
        fVar1 = *pfVar2;
        pfVar2 = tcu::Vector<float,_4>::operator[]
                           ((Vector<float,_4> *)
                            (&j + (long)(iWeightInterval.m_hi._4_4_ * 2 + jWeightInterval.m_hi._4_4_
                                        ) * 4),texelInterval.m_hi._4_4_);
        tcu::Interval::Interval((Interval *)local_200,false,(double)fVar1,(double)*pfVar2);
        lVar3 = (long)texelInterval.m_hi._4_4_;
        tcu::operator*((Interval *)local_248,(Interval *)local_1b0,(Interval *)local_200);
        tcu::operator+(&local_230,(Interval *)(local_138 + lVar3 * 0x18),(Interval *)local_248);
        tcu::FloatFormat::roundOut(&local_218,&this->m_filteringPrecision,&local_230,false);
        lVar3 = (long)texelInterval.m_hi._4_4_;
        *(undefined8 *)(local_138 + lVar3 * 0x18) = local_218._0_8_;
        *(double *)(resultIntervals + lVar3) = local_218.m_lo;
        resultIntervals[lVar3].m_lo = local_218.m_hi;
      }
    }
  }
  for (local_24c = 0; local_24c < 4; local_24c = local_24c + 1) {
    dVar4 = tcu::Interval::lo((Interval *)(local_138 + (long)local_24c * 0x18));
    pfVar2 = tcu::Vector<float,_4>::operator[](resultMin,local_24c);
    *pfVar2 = (float)dVar4;
    dVar4 = tcu::Interval::hi((Interval *)(local_138 + (long)local_24c * 0x18));
    pfVar2 = tcu::Vector<float,_4>::operator[](resultMax,local_24c);
    *pfVar2 = (float)dVar4;
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample2D (const IVec3&	texelBase,
										  const Vec2&	weights,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[4];
	Vec4 texelsMax[4];

	for (int i = 0; i < 2; ++i)
	{
		for (int j = 0; j < 2; ++j)
		{
		    fetchTexel(texelBase + IVec3(i, j, 0), layer, level, VK_FILTER_LINEAR, texelsMin[2 * j + i], texelsMax[2 * j + i]);
		}
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

	for (int i = 0; i < 2; ++i)
	{
		const Interval iWeightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weights[1] : weights[1]), false);

		for (int j = 0; j < 2; ++j)
		{
		    const Interval jWeightInterval = m_filteringPrecision.roundOut(iWeightInterval * Interval(j == 0 ? 1.0f - weights[0] : weights[0]), false);

			for (int compNdx = 0; compNdx < 4; ++compNdx)
			{
				const Interval texelInterval(false, texelsMin[2 * i + j][compNdx], texelsMax[2 * i + j][compNdx]);

				resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + jWeightInterval * texelInterval, false);
			}
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}